

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Global * __thiscall wabt::Module::GetGlobal(Module *this,Var *var)

{
  pointer ppGVar1;
  Index IVar2;
  Global *pGVar3;
  
  IVar2 = BindingHash::FindIndex(&this->global_bindings,var);
  ppGVar1 = (this->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->globals).
                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3)) {
    pGVar3 = ppGVar1[IVar2];
  }
  else {
    pGVar3 = (Global *)0x0;
  }
  return pGVar3;
}

Assistant:

const Global* Module::GetGlobal(const Var& var) const {
  return const_cast<Module*>(this)->GetGlobal(var);
}